

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O1

void __thiscall PathMatcher<int>::Path::~Path(Path *this)

{
  Path *this_00;
  pointer ppPVar1;
  ulong uVar2;
  
  ppPVar1 = (this->children).
            super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
    uVar2 = 0;
    do {
      this_00 = ppPVar1[uVar2];
      if (this_00 != (Path *)0x0) {
        ~Path(this_00);
        operator_delete(this_00,0x28);
      }
      uVar2 = uVar2 + 1;
      ppPVar1 = (this->children).
                super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->children).
                                   super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3))
    ;
  }
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1,(long)(this->children).
                                  super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar1
                   );
    return;
  }
  return;
}

Assistant:

~Path() {
            for(size_t i = 0; i < children.size(); i++) {
                delete children[i];
            }
        }